

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O0

void write_binary_yzplane<cellb>
               (ofstream *f,field3d<cellb> *data,_func_double_field3d<cellb>_ptr_int_int_int *get,
               int i,int ny,int nz)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  undefined4 in_ECX;
  code *in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 uVar4;
  int k;
  int j;
  double *a;
  undefined4 local_38;
  undefined4 local_34;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(in_R8D * in_R9D);
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  for (local_34 = 0; local_34 < in_R8D; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < in_R9D; local_38 = local_38 + 1) {
      uVar4 = (*in_RDX)(in_RSI,in_ECX,local_34,local_38);
      *(undefined8 *)((long)pvVar3 + (long)(local_34 * in_R9D + local_38) * 8) = uVar4;
    }
  }
  std::ostream::write(in_RDI,(long)pvVar3);
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  return;
}

Assistant:

void write_binary_yzplane(ofstream* f, field3d<T> & data, double
        get(field3d<T>&, int, int, int), int i, int ny, int nz) {
    double* a = new double[ny * nz];
    for(int j=0;j<ny;j++)
        for(int k=0;k<nz;k++)
            a[j * nz + k] = get(data, i, j, k);
    f->write(reinterpret_cast<char*>(a), sizeof(double) * (ny * nz));
    delete[] a;
}